

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realdata_unit.c
# Opt level: O2

_Bool slow_bitmap_equals(roaring_bitmap_t *bitmap1,roaring_bitmap_t *bitmap2)

{
  _Bool _Var1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint32_t *ans;
  uint32_t *ans_00;
  
  uVar2 = roaring_bitmap_get_cardinality(bitmap1);
  uVar3 = roaring_bitmap_get_cardinality(bitmap2);
  ans = (uint32_t *)malloc(uVar2 * 4);
  ans_00 = (uint32_t *)malloc(uVar3 * 4);
  roaring_bitmap_to_uint32_array(bitmap1,ans);
  roaring_bitmap_to_uint32_array(bitmap2,ans_00);
  _Var1 = array_equals(ans,(int32_t)uVar2,ans_00,(int32_t)uVar3);
  free(ans);
  free(ans_00);
  return _Var1;
}

Assistant:

bool slow_bitmap_equals(roaring_bitmap_t *bitmap1, roaring_bitmap_t *bitmap2) {
    uint64_t card1, card2;
    card1 = roaring_bitmap_get_cardinality(bitmap1);
    card2 = roaring_bitmap_get_cardinality(bitmap2);
    uint32_t *arr1 = (uint32_t *)malloc(card1 * sizeof(uint32_t));
    uint32_t *arr2 = (uint32_t *)malloc(card2 * sizeof(uint32_t));
    roaring_bitmap_to_uint32_array(bitmap1, arr1);
    roaring_bitmap_to_uint32_array(bitmap2, arr2);
    bool answer = array_equals(arr1, card1, arr2, card2);
    free(arr1);
    free(arr2);
    return answer;
}